

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3SectorSize(sqlite3_file *pFile)

{
  _func_int_sqlite3_file_ptr *p_Var1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  p_Var1 = pFile->pMethods->xSectorSize;
  if (p_Var1 != (_func_int_sqlite3_file_ptr *)0x0) {
    uVar2 = (*p_Var1)(pFile);
    uVar4 = 0x10000;
    if (uVar2 < 0x10000) {
      uVar4 = uVar2;
    }
    uVar3 = 0x200;
    if (0x1f < (int)uVar2) {
      uVar3 = uVar4;
    }
    return uVar3;
  }
  return 0x1000;
}

Assistant:

SQLITE_PRIVATE int sqlite3SectorSize(sqlite3_file *pFile){
  int iRet = sqlite3OsSectorSize(pFile);
  if( iRet<32 ){
    iRet = 512;
  }else if( iRet>MAX_SECTOR_SIZE ){
    assert( MAX_SECTOR_SIZE>=512 );
    iRet = MAX_SECTOR_SIZE;
  }
  return iRet;
}